

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

void __thiscall
cppgenerate::Class::printVariables(Class *this,ostream *stream,AccessModifier modifier)

{
  pointer pMVar1;
  AccessModifier AVar2;
  ostream *poVar3;
  bool bVar4;
  pointer other;
  string accessString;
  MemberVariable variable;
  char *local_e0;
  long local_d8;
  char local_d0 [16];
  MemberVariable local_c0;
  
  local_e0 = local_d0;
  local_d8 = 0;
  local_d0[0] = '\0';
  if (modifier < (PROTECTED|PRIVATE)) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_e0,0,(char *)0x0,(ulong)(&PTR_anon_var_dwarf_7ec6_00119d28)[modifier]);
  }
  other = (this->m_memberVariables).
          super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (this->m_memberVariables).
           super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (other != pMVar1) {
    bVar4 = false;
    do {
      MemberVariable::MemberVariable(&local_c0,other);
      AVar2 = MemberVariable::accessModifier(&local_c0);
      if (AVar2 == modifier) {
        if (!bVar4) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>(stream,local_e0,local_d8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
        bVar4 = true;
        MemberVariable::print(&local_c0,stream,4,false);
      }
      MemberVariable::~MemberVariable(&local_c0);
      other = other + 1;
    } while (other != pMVar1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  return;
}

Assistant:

void Class::printVariables( std::ostream& stream, AccessModifier modifier ) const{
    bool havePrinted = false;
    std::string accessString;

    switch( modifier ){
    case cppgenerate::AccessModifier::PRIVATE: accessString = "private:"; break;
    case cppgenerate::AccessModifier::PUBLIC: accessString = "public:"; break;
    case cppgenerate::AccessModifier::PROTECTED: accessString = "protected:"; break;
    }

    for( cppgenerate::MemberVariable variable : m_memberVariables ){
        if( variable.accessModifier() != modifier ) continue;
        if( !havePrinted ){
            stream << accessString << std::endl;
            havePrinted = true;
        }
        variable.print( stream, 4, false );
    }
}